

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AList.hpp
# Opt level: O2

ostream * operator<<(ostream *stream,ItemInfo *ref)

{
  char *pcVar1;
  
  switch((ref->m_value).type) {
  case IVT_BOOL:
    std::ostream::_M_insert<bool>(SUB81(stream,0));
    break;
  case IVT_INT:
    std::ostream::operator<<(stream,(ref->m_value).field_3.iValue);
    break;
  case IVT_FLOAT:
    std::ostream::operator<<(stream,(ref->m_value).field_3.fValue);
    break;
  case IVT_DOUBLE:
    std::ostream::_M_insert<double>((ref->m_value).field_3.eValue);
    break;
  case IVT_STRING:
    pcVar1 = (ref->m_value).field_3.sValue;
    goto LAB_00104695;
  case IVT_LIST:
    pcVar1 = "[List]";
    goto LAB_00104695;
  case IVT_OBJECT:
    pcVar1 = "[Object]";
LAB_00104695:
    std::operator<<(stream,pcVar1);
  }
  return stream;
}

Assistant:

inline ostream& operator << (ostream &stream, ItemInfo& ref)
        {
            switch (ref.get_type())
            {
                case IVT_BOOL:
                {
                    stream << ref.get_value().bValue;
                }
                break;

                case IVT_INT:
                {
                    stream << ref.get_value().iValue;
                }
                break;

                case IVT_FLOAT:
                {
                    stream << ref.get_value().fValue;
                }
                break;

                case IVT_DOUBLE:
                {
                    stream << ref.get_value().eValue;
                }
                break;

                case IVT_STRING:
                {
                    stream << ref.get_value().sValue;
                }
                break;

                case IVT_LIST:
                {
                    stream << "[List]";
                }
                break;

                case IVT_OBJECT:
                {
                    stream << "[Object]";
                }
                break;

                default:
                {
                }
                break;
            }

            return stream;
        }